

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O2

string * tinyusdz::io::JoinPath(string *__return_storage_ptr__,string *dir,string *filename)

{
  bool bVar1;
  string basedir;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (dir->_M_string_length == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    if ((dir->_M_dataplus)._M_p[dir->_M_string_length - 1] == '/') {
      ::std::__cxx11::string::_M_assign((string *)&local_90);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_70,"/",&local_91);
      ::std::operator+(&local_50,dir,&local_70);
      ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    if (local_90._M_string_length == 0) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_50,"./",(allocator *)&local_70);
      bVar1 = startsWith(filename,&local_50);
      ::std::__cxx11::string::_M_dispose();
      if (bVar1) {
        ::std::__cxx11::string::string((string *)&local_70,"./",&local_91);
        removePrefix(&local_50,filename,&local_70);
        ::std::operator+(__return_storage_ptr__,&local_90,&local_50);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ::std::operator+(__return_storage_ptr__,&local_90,filename);
      }
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinPath(const std::string &dir, const std::string &filename) {
  if (dir.empty()) {
    return filename;
  } else {
    // check '/'
    char lastChar = *dir.rbegin();

    // TODO: Support more relative path case.

    std::string basedir;
    if (lastChar != '/') {
      basedir = dir + std::string("/");
    } else {
      basedir = dir;
    }

    if (basedir.size()) {
      if (startsWith(filename, "./")) {
        // strip "./"
        return basedir + removePrefix(filename, "./");
      }
      return basedir + filename;
    } else {
      return filename;
    }
  }
}